

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  char cVar1;
  int iVar2;
  const_iterator cVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t *ts_00;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  allocator local_48 [16];
  undefined1 local_38 [20];
  uint32_t local_24;
  uint *ts_3;
  
  iVar2 = *(int *)&(type->super_IVariant).field_0xc;
  local_24 = id;
  if (iVar2 < 0x10) {
    if (iVar2 == 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "void";
      pcVar5 = "";
      goto LAB_0020f9d0;
    }
    if (iVar2 == 0xf) {
      if ((this->super_CompilerGLSL).backend.explicit_struct_type != true) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
        return __return_storage_ptr__;
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_48,this,(ulong)(type->super_IVariant).self.id);
      join<char_const(&)[8],std::__cxx11::string>
                (__return_storage_ptr__,(spirv_cross *)"struct ",(char (*) [8])local_48,ts_1);
      if ((undefined1 *)local_48._0_8_ == local_38) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_48._0_8_);
      return __return_storage_ptr__;
    }
  }
  else {
    if (iVar2 - 0x10U < 2) {
      image_type_hlsl_abi_cxx11_(__return_storage_ptr__,this,type,id);
      return __return_storage_ptr__;
    }
    if (iVar2 == 0x12) {
      cVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,&local_24);
      pcVar6 = "SamplerComparisonState";
      if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        pcVar6 = "SamplerState";
      }
      pcVar5 = pcVar6 + 0x16;
      if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        pcVar5 = pcVar6 + 0xc;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      goto LAB_0020f9d0;
    }
  }
  uVar7 = type->columns ^ 1 | type->vecsize ^ 1;
  ts_3 = (uint *)(ulong)uVar7;
  if (uVar7 == 0) {
    switch(iVar2) {
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "bool";
      pcVar5 = "";
      break;
    default:
      goto switchD_0020fa19_caseD_3;
    case 5:
      cVar1 = this->field_0x2425;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (cVar1 == '\x01') {
        pcVar6 = "int16_t";
        pcVar5 = "";
      }
      else {
        pcVar6 = "min16int";
        pcVar5 = "";
      }
      break;
    case 6:
      cVar1 = this->field_0x2425;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (cVar1 == '\x01') {
        pcVar6 = "uint16_t";
        pcVar5 = "";
      }
      else {
        pcVar6 = "min16uint";
        pcVar5 = "";
      }
      break;
    case 7:
      pcVar6 = (this->super_CompilerGLSL).backend.basic_int_type;
      goto LAB_0020fb12;
    case 8:
      pcVar6 = (this->super_CompilerGLSL).backend.basic_uint_type;
LAB_0020fb12:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,local_48);
      return __return_storage_ptr__;
    case 9:
      if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x3c) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._0_8_ = local_38;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"64-bit integers only supported in SM 6.0.","");
        ::std::runtime_error::runtime_error(prVar4,(string *)local_48);
        *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "int64_t";
      pcVar5 = "";
      break;
    case 10:
      if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x3c) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._0_8_ = local_38;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"64-bit integers only supported in SM 6.0.","");
        ::std::runtime_error::runtime_error(prVar4,(string *)local_48);
        *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "uint64_t";
      pcVar5 = "";
      break;
    case 0xb:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "atomic_uint";
      pcVar5 = "";
      break;
    case 0xc:
      cVar1 = this->field_0x2425;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (cVar1 == '\x01') {
        pcVar6 = "half";
        pcVar5 = "";
      }
      else {
        pcVar6 = "min16float";
        pcVar5 = "";
      }
      break;
    case 0xd:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "float";
      pcVar5 = "";
      break;
    case 0xe:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "double";
      pcVar5 = "";
    }
LAB_0020f9d0:
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar6,pcVar5);
    return __return_storage_ptr__;
  }
  ts = &type->vecsize;
  uVar7 = iVar2 - 2;
  if (type->vecsize < 2 || type->columns != 1) {
    if (0xc < uVar7) {
switchD_0020fa19_caseD_3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "???";
      pcVar5 = "";
      goto LAB_0020f9d0;
    }
    ts_00 = &type->columns;
    switch(uVar7) {
    case 0:
      pcVar6 = "bool";
      goto LAB_0020fca0;
    default:
      goto switchD_0020fa19_caseD_3;
    case 3:
      pcVar6 = "int16_t";
      local_48._0_8_ = "min16int";
      break;
    case 4:
      pcVar6 = "uint16_t";
      local_48._0_8_ = "min16uint";
      break;
    case 5:
      join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x2e1697,(char (*) [4])ts_00,(uint *)0x2def05
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 6:
      pcVar6 = "uint";
LAB_0020fca0:
      join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar6,(char (*) [5])ts_00,(uint *)0x2def05,
                 (char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 10:
      pcVar6 = "half";
      local_48._0_8_ = "min16float";
      break;
    case 0xb:
      join<char_const(&)[6],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x2e4d94,(char (*) [6])ts_00,(uint *)0x2def05
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 0xc:
      join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x2e3eb0,(char (*) [7])ts_00,(uint *)0x2def05
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    }
    if (this->field_0x2425 != '\0') {
      local_48._0_8_ = pcVar6;
    }
    join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)local_48,(char **)ts_00,(uint *)0x2def05,
               (char (*) [2])ts,ts_3);
    return __return_storage_ptr__;
  }
  switch(uVar7) {
  case 0:
    pcVar6 = "bool";
    goto LAB_0020fd33;
  default:
    goto switchD_0020fa19_caseD_3;
  case 3:
    pcVar6 = "int16_t";
    local_48._0_8_ = "min16int";
    break;
  case 4:
    pcVar6 = "uint16_t";
    local_48._0_8_ = "min16uint";
    break;
  case 5:
    join<char_const(&)[4],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x2e1697,(char (*) [4])ts,
               &switchD_0020fa74::switchdataD_002e0b10);
    return __return_storage_ptr__;
  case 6:
    pcVar6 = "uint";
LAB_0020fd33:
    join<char_const(&)[5],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar6,(char (*) [5])ts,
               &switchD_0020fa74::switchdataD_002e0b10);
    return __return_storage_ptr__;
  case 7:
    pcVar6 = "i64vec";
    goto LAB_0020fd4a;
  case 8:
    pcVar6 = "u64vec";
    goto LAB_0020fd4a;
  case 10:
    pcVar6 = "half";
    local_48._0_8_ = "min16float";
    break;
  case 0xb:
    join<char_const(&)[6],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x2e4d94,(char (*) [6])ts,
               &switchD_0020fa74::switchdataD_002e0b10);
    return __return_storage_ptr__;
  case 0xc:
    pcVar6 = "double";
LAB_0020fd4a:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar6,(char (*) [7])ts,
               &switchD_0020fa74::switchdataD_002e0b10);
    return __return_storage_ptr__;
  }
  if (this->field_0x2425 != '\0') {
    local_48._0_8_ = pcVar6;
  }
  join<char_const*,unsigned_int_const&>
            (__return_storage_ptr__,(spirv_cross *)local_48,(char **)ts,(uint *)local_48._0_8_);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	// Ignore the pointer type since GLSL doesn't have pointers.

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_hlsl(type, id);

	case SPIRType::Sampler:
		return comparison_ids.count(id) ? "SamplerComparisonState" : "SamplerState";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			if (hlsl_options.enable_16bit_types)
				return "half";
			else
				return "min16float";
		case SPIRType::Short:
			if (hlsl_options.enable_16bit_types)
				return "int16_t";
			else
				return "min16int";
		case SPIRType::UShort:
			if (hlsl_options.enable_16bit_types)
				return "uint16_t";
			else
				return "min16uint";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "int64_t";
		case SPIRType::UInt64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.vecsize);
		case SPIRType::Int:
			return join("int", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.vecsize);
		case SPIRType::Float:
			return join("float", type.vecsize);
		case SPIRType::Double:
			return join("double", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("int", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.columns, "x", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.columns, "x", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("float", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("double", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}